

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transaction.c
# Opt level: O0

int wally_tx_output_init_alloc
              (uint64_t satoshi,uchar *script,size_t script_len,wally_tx_output **output)

{
  wally_tx_output *pwVar1;
  int ret;
  wally_tx_output *result;
  wally_tx_output **output_local;
  size_t script_len_local;
  uchar *script_local;
  uint64_t satoshi_local;
  
  if (output == (wally_tx_output **)0x0) {
    satoshi_local._4_4_ = -2;
  }
  else {
    *output = (wally_tx_output *)0x0;
    pwVar1 = (wally_tx_output *)wally_calloc(0x70);
    *output = pwVar1;
    if (*output == (wally_tx_output *)0x0) {
      satoshi_local._4_4_ = -3;
    }
    else {
      pwVar1 = *output;
      satoshi_local._4_4_ = wally_tx_output_init(satoshi,script,script_len,pwVar1);
      if (satoshi_local._4_4_ != 0) {
        clear_and_free(pwVar1,0x70);
        *output = (wally_tx_output *)0x0;
      }
    }
  }
  return satoshi_local._4_4_;
}

Assistant:

int wally_tx_output_init_alloc(uint64_t satoshi,
                               const unsigned char *script, size_t script_len,
                               struct wally_tx_output **output)
{
    struct wally_tx_output *result;
    int ret;

    TX_CHECK_OUTPUT;
    TX_OUTPUT_ALLOC(struct wally_tx_output);

    ret = wally_tx_output_init(satoshi, script, script_len, result);

    if (ret != WALLY_OK) {
        clear_and_free(result, sizeof(*result));
        *output = NULL;
    }
    return ret;
}